

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O0

vmd_bst_node_t * vmd_bst_node_adj(vmd_bst_node_t *node,int dir)

{
  vmd_bst_node_t *pvStack_18;
  int dir_local;
  vmd_bst_node_t *node_local;
  
  pvStack_18 = node;
  if (node->child[dir] == (vmd_bst_node_t *)0x0) {
    for (; pvStack_18 != pvStack_18->parent; pvStack_18 = pvStack_18->parent) {
      if ((uint)((byte)pvStack_18->field_0x20 >> 3 & 1) != dir) {
        return pvStack_18->parent;
      }
    }
    node_local = pvStack_18;
  }
  else {
    node_local = vmd_bst_node_child_most(node->child[dir],(uint)((dir != 0 ^ 0xffU) & 1));
  }
  return node_local;
}

Assistant:

bst_node_t *
bst_node_adj(bst_node_t *node, int dir)
{
	if (node->child[dir] != NULL)
		return bst_node_child_most(node->child[dir], !dir);

	for (; !bst_node_is_end(node); node = node->parent) {
		if (node->idx != dir)
			return node->parent;
	}

	return node;
}